

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp6.c
# Opt level: O0

ReturnCode scanstring(Global *global,int delim,_func_ReturnCode_Global_ptr_int *outfun)

{
  ReturnCode RVar1;
  int iVar2;
  code *in_RDX;
  uint in_ESI;
  Global *in_RDI;
  bool bVar3;
  ReturnCode ret;
  int c;
  Global *in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffdc;
  
  in_RDI->instring = 1;
  RVar1 = (*in_RDX)(in_RDI,in_ESI);
  do {
    if (RVar1 != FPP_OK) {
      return RVar1;
    }
    do {
      in_stack_ffffffffffffffdc = get((Global *)((ulong)in_stack_ffffffffffffffdc << 0x20));
      bVar3 = false;
      if ((in_stack_ffffffffffffffdc != in_ESI) && (bVar3 = false, in_stack_ffffffffffffffdc != 10))
      {
        bVar3 = in_stack_ffffffffffffffdc != 0;
      }
      if (!bVar3) {
        in_RDI->instring = 0;
        if (in_stack_ffffffffffffffdc == in_ESI) {
          RVar1 = (*in_RDX)(in_RDI,in_stack_ffffffffffffffdc);
          return RVar1;
        }
        cerror(in_RDI,ERROR_UNTERMINATED_STRING);
        unget(in_stack_ffffffffffffffc0);
        return FPP_UNTERMINATED_STRING;
      }
      RVar1 = (*in_RDX)(in_RDI,in_stack_ffffffffffffffdc);
      if (RVar1 != FPP_OK) {
        return RVar1;
      }
    } while (in_stack_ffffffffffffffdc != 0x5c);
    in_stack_ffffffffffffffc0 = in_RDI;
    iVar2 = get((Global *)0x5c00000000);
    RVar1 = (*in_RDX)(in_stack_ffffffffffffffc0,iVar2);
  } while( true );
}

Assistant:

ReturnCode scanstring(struct Global *global,
		      int delim, /* ' or " */
		      /* Output function: */
		      ReturnCode (*outfun)(struct Global *, int))
{
  /*
   * Scan off a string.  Warning if terminated by newline or EOF.
   * outfun() outputs the character -- to a buffer if in a macro.
   * TRUE if ok, FALSE if error.
   */

  int c;
  ReturnCode ret;
  
  global->instring = TRUE;		/* Don't strip comments         */
  ret=(*outfun)(global, delim);
  if(ret)
    return(ret);
  while ((c = get(global)) != delim
	 && c != '\n'
	 && c != EOF_CHAR) {
    ret=(*outfun)(global, c);
    if(ret)
      return(ret);
    if (c == '\\') {
      ret=(*outfun)(global, get(global));
      if(ret)
	return(ret);
    }
  }
  global->instring = FALSE;
  if (c == delim) {
    ret=(*outfun)(global, c);
    return(ret);
  } else {
    cerror(global, ERROR_UNTERMINATED_STRING);
    unget(global);
    return(FPP_UNTERMINATED_STRING);
  }
}